

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall duckdb::BaseAppender::InitializeChunk(BaseAppender *this)

{
  vector<duckdb::LogicalType,_true> *types;
  
  DataChunk::Destroy(&this->chunk);
  types = &this->types;
  if ((this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    types = &this->active_types;
  }
  DataChunk::Initialize(&this->chunk,this->allocator,types,0x800);
  return;
}

Assistant:

void BaseAppender::InitializeChunk() {
	chunk.Destroy();
	chunk.Initialize(allocator, GetActiveTypes());
}